

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::prune(Dictionary *this,vector<int,_std::allocator<int>_> *idx)

{
  pointer peVar1;
  entry_type eVar2;
  int32_t iVar3;
  const_iterator __cbeg;
  mapped_type *pmVar4;
  pointer peVar5;
  pointer *ppiVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  pointer piVar10;
  iterator __position;
  vector<int,std::allocator<int>> *this_00;
  iterator __begin2;
  int *piVar11;
  int32_t j;
  int iVar12;
  pointer piVar13;
  ulong uVar14;
  vector<int,_std::allocator<int>_> words;
  vector<int,_std::allocator<int>_> ngrams;
  vector<int,_std::allocator<int>_> local_88;
  int *local_68;
  pointer piStack_60;
  int *local_58;
  vector<int,std::allocator<int>> *local_48;
  int local_3c;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *local_38;
  
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_58 = (int *)0x0;
  local_68 = (int *)0x0;
  piStack_60 = (int *)0x0;
  piVar13 = (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if (piVar13 !=
      (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
     ) {
    do {
      if (*piVar13 < this->nwords_) {
        ppiVar6 = &local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        __position._M_current =
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        piVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        this_00 = (vector<int,std::allocator<int>> *)&local_88;
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_00117613;
LAB_00117632:
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_00,__position,piVar13);
      }
      else {
        ppiVar6 = &piStack_60;
        __position._M_current = piStack_60;
        piVar10 = piStack_60;
        this_00 = (vector<int,std::allocator<int>> *)&local_68;
        if (piStack_60 == local_58) goto LAB_00117632;
LAB_00117613:
        *piVar10 = *piVar13;
        *ppiVar6 = piVar10 + 1;
      }
      piVar13 = piVar13 + 1;
    } while (piVar13 !=
             (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish);
  }
  piVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  piVar13 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar13,piVar10);
  }
  std::vector<int,_std::allocator<int>_>::operator=(idx,&local_88);
  piVar13 = piStack_60;
  if (piStack_60 != local_68) {
    iVar12 = 0;
    piVar11 = local_68;
    local_48 = (vector<int,std::allocator<int>> *)idx;
    do {
      local_3c = *piVar11 - this->nwords_;
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->pruneidx_,&local_3c);
      *pmVar4 = iVar12;
      iVar12 = iVar12 + 1;
      piVar11 = piVar11 + 1;
    } while (piVar11 != piVar13);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_48,*(undefined8 *)(local_48 + 8),local_68,piStack_60);
  }
  this->pruneidx_size_ = (this->pruneidx_)._M_h._M_element_count;
  piVar13 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar10 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (piVar13 != piVar10) {
    memset(piVar13,0xff,((long)piVar10 + (-4 - (long)piVar13) & 0xfffffffffffffffcU) + 4);
  }
  local_38 = &this->words_;
  peVar5 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)peVar5;
  if (lVar8 != 0) {
    uVar14 = 0;
    lVar9 = 0x30;
    iVar12 = 0;
    do {
      eVar2 = getType(this,(int32_t)uVar14);
      uVar7 = (ulong)iVar12;
      if ((eVar2 == label) ||
         ((uVar7 < (ulong)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2) &&
          (uVar14 == (uint)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar7])))) {
        local_48 = (vector<int,std::allocator<int>> *)CONCAT44(local_48._4_4_,iVar12);
        peVar1 = (local_38->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        peVar5 = peVar1 + uVar7;
        std::__cxx11::string::_M_assign((string *)peVar5);
        peVar5->type = *(entry_type *)((long)peVar1 + lVar9 + -8);
        peVar5->count = *(int64_t *)((long)peVar1 + lVar9 + -0x10);
        std::vector<int,_std::allocator<int>_>::operator=
                  (&peVar5->subwords,
                   (vector<int,_std::allocator<int>_> *)
                   ((long)&(peVar1->word)._M_dataplus._M_p + lVar9));
        iVar3 = find(this,&(this->words_).
                           super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar7].word);
        (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar3] = (int)local_48;
        iVar12 = (int)local_48 + 1;
      }
      uVar14 = uVar14 + 1;
      peVar5 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar8 = (long)(this->words_).
                    super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)peVar5;
      uVar7 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar9 = lVar9 + 0x48;
    } while (uVar14 <= uVar7 && uVar7 - uVar14 != 0);
  }
  iVar12 = (int)((ulong)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  this->nwords_ = iVar12;
  lVar9 = (long)iVar12 + (long)this->nlabels_;
  this->size_ = (int32_t)lVar9;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase
            (local_38,peVar5 + lVar9,(entry *)((long)&(peVar5->word)._M_dataplus._M_p + lVar8));
  initNgrams(this);
  if (local_68 != (int *)0x0) {
    operator_delete(local_68);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Dictionary::prune(std::vector<int32_t>& idx) {
  std::vector<int32_t> words, ngrams;
  for (auto it = idx.cbegin(); it != idx.cend(); ++it) {
    if (*it < nwords_) {words.push_back(*it);}
    else {ngrams.push_back(*it);}
  }
  std::sort(words.begin(), words.end());
  idx = words;

  if (ngrams.size() != 0) {
    int32_t j = 0;
    for (const auto ngram : ngrams) {
      pruneidx_[ngram - nwords_] = j;
      j++;
    }
    idx.insert(idx.end(), ngrams.begin(), ngrams.end());
  }
  pruneidx_size_ = pruneidx_.size();

  std::fill(word2int_.begin(), word2int_.end(), -1);

  int32_t j = 0;
  for (int32_t i = 0; i < words_.size(); i++) {
    if (getType(i) == entry_type::label || (j < words.size() && words[j] == i)) {
      words_[j] = words_[i];
      word2int_[find(words_[j].word)] = j;
      j++;
    }
  }
  nwords_ = words.size();
  size_ = nwords_ +  nlabels_;
  words_.erase(words_.begin() + size_, words_.end());
  initNgrams();
}